

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O3

wstring_view __thiscall
mjs::string_object::handle_array_like_access(string_object *this,wstring_view property_name)

{
  uint32_t uVar1;
  size_t sVar2;
  gc_string *pgVar3;
  gc_string *pgVar4;
  wstring_view wVar5;
  wstring_view local_20;
  
  local_20._M_str = property_name._M_str;
  local_20._M_len = property_name._M_len;
  pgVar4 = (gc_string *)0x0;
  sVar2 = 0;
  if (this->is_v5_or_later_ == true) {
    uVar1 = index_value_from_string(&local_20);
    if (uVar1 == 0xffffffff) {
      pgVar4 = (gc_string *)0x0;
      sVar2 = 0;
    }
    else {
      pgVar3 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                         ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)
                          &(this->super_native_object).field_0x24,
                          (this->super_native_object).super_object.heap_);
      pgVar4 = (gc_string *)0x0;
      sVar2 = 0;
      if (uVar1 < pgVar3->length_) {
        pgVar4 = pgVar3 + (ulong)uVar1 + 1;
        sVar2 = 1;
      }
    }
  }
  wVar5._M_str = (wchar_t *)pgVar4;
  wVar5._M_len = sVar2;
  return wVar5;
}

Assistant:

std::wstring_view handle_array_like_access(const std::wstring_view property_name) const {
        if (is_v5_or_later_) {
            if (const uint32_t index = index_value_from_string(property_name); index != invalid_index_value) {
                auto v = view();
                if (index < v.length()) {
                    return v.substr(index, 1);
                }
            }
        }
        return {};
    }